

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void soul::SanityCheckPass::checkOverallStructure(ModuleBase *module)

{
  int iVar1;
  ProcessorBase *processorOrGraph;
  undefined4 extraout_var;
  undefined8 *extraout_RDX;
  undefined8 *puVar2;
  
  processorOrGraph =
       (ProcessorBase *)
       __dynamic_cast(module,&AST::ModuleBase::typeinfo,&AST::ProcessorBase::typeinfo,0);
  if (processorOrGraph != (ProcessorBase *)0x0) {
    checkOverallStructureOfProcessor(processorOrGraph);
  }
  iVar1 = (*(module->super_Scope)._vptr_Scope[0x11])(&module->super_Scope);
  for (puVar2 = (undefined8 *)CONCAT44(extraout_var,iVar1); puVar2 != extraout_RDX;
      puVar2 = puVar2 + 1) {
    checkOverallStructure((ModuleBase *)*puVar2);
  }
  return;
}

Assistant:

static void checkOverallStructure (AST::ModuleBase& module)
    {
        if (auto p = cast<AST::ProcessorBase> (module))
            checkOverallStructureOfProcessor (*p);

        for (auto m : module.getSubModules())
            checkOverallStructure (m);
    }